

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O1

MPP_RET bits_model_init(RcModelV2Ctx *ctx)

{
  int iVar1;
  RcMode RVar2;
  RK_U32 RVar3;
  int iVar4;
  MPP_RET MVar5;
  long lVar6;
  RK_S64 RVar7;
  uint uVar8;
  uint uVar9;
  MPP_RET MVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  iVar1 = (ctx->usr_cfg).igop;
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","bits_model_init",ctx);
  }
  uVar9 = (ctx->usr_cfg).max_i_bit_prop;
  uVar8 = (ctx->usr_cfg).min_i_bit_prop;
  if (99 < (int)uVar8) {
    uVar8 = 100;
  }
  uVar11 = 10;
  if (10 < (int)uVar8) {
    uVar11 = (ulong)uVar8;
  }
  (ctx->usr_cfg).min_i_bit_prop = (int)uVar11;
  uVar8 = 100;
  if ((int)uVar9 < 100) {
    uVar8 = uVar9;
  }
  uVar12 = (ulong)uVar8;
  if ((int)uVar9 < (int)uVar11) {
    uVar12 = uVar11;
  }
  (ctx->usr_cfg).max_i_bit_prop = (RK_S32)uVar12;
  uVar9 = (ctx->usr_cfg).init_ip_ratio;
  uVar8 = 0x280;
  if ((int)uVar9 < 0x280) {
    uVar8 = uVar9;
  }
  uVar13 = 0xa0;
  if (0xa0 < (int)uVar8) {
    uVar13 = (ulong)uVar8;
  }
  (ctx->usr_cfg).init_ip_ratio = (RK_S32)uVar13;
  if (((byte)rc_debug & 0x40) != 0) {
    _mpp_log_l(4,"rc_model_v2","min_i_bit_prop %d max_i_bit_prop %d, init_ip_ratio %d",
               "bits_model_init",uVar11,uVar12,uVar13);
  }
  if (iVar1 == 1) {
    if (((byte)rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","all intra gop \n","bits_model_init");
    }
    (ctx->usr_cfg).init_ip_ratio = 0x10;
    uVar9 = 500;
    if ((ctx->usr_cfg).debreath_cfg.enable != 0) {
      (ctx->usr_cfg).debreath_cfg.enable = 0;
    }
  }
  else if (iVar1 == 0) {
    uVar9 = 500;
    if (((byte)rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","infinte gop, set default for rc bit calc\n","bits_model_init");
    }
  }
  else {
    uVar8 = (ctx->usr_cfg).igop;
    uVar9 = 500;
    if ((int)uVar8 < 500) {
      uVar9 = uVar8;
    }
  }
  (ctx->usr_cfg).igop = uVar9;
  ctx->max_still_qp = 0x23;
  ctx->motion_sensitivity = 0x5a;
  ctx->first_frm_flg = 1;
  ctx->gop_qp_sum = 0;
  ctx->gop_frm_cnt = 0;
  if ((ctx->usr_cfg).fps_chg_prop == 0) {
    (ctx->usr_cfg).fps_chg_prop = 0x19;
  }
  RVar2 = (ctx->usr_cfg).mode;
  uVar8 = (ctx->usr_cfg).bps_max;
  ctx->re_calc_ratio = reenc_calc_vbr_ratio;
  switch(RVar2) {
  case RC_VBR:
    ctx->calc_ratio = calc_vbr_ratio;
    break;
  case RC_CBR:
    ctx->calc_ratio = calc_cbr_ratio;
    ctx->re_calc_ratio = reenc_calc_cbr_ratio;
    uVar8 = (ctx->usr_cfg).bps_target;
    break;
  case RC_FIXQP:
    return MPP_OK;
  case RC_AVBR:
    ctx->calc_ratio = calc_avbr_ratio;
    lVar6 = (long)(ctx->usr_cfg).bps_min;
    RVar3 = 0x19;
    if (uVar8 != 0 && lVar6 != 0) {
      RVar3 = (RK_U32)((lVar6 * 100) / (long)(int)uVar8);
    }
    ctx->min_still_percent = RVar3;
    if (((byte)rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","min_still_percent  %d","bits_model_init",
                 (ulong)ctx->min_still_percent);
    }
    break;
  default:
    _mpp_log_l(4,"rc_model_v2","rc mode set error",(char *)0x0);
  }
  ctx->target_bps = (ctx->usr_cfg).bps_target;
  if ((int)uVar9 < 1) {
    uVar11 = (ulong)(ctx->usr_cfg).fps.fps_out_num;
  }
  else {
    uVar11 = (ulong)uVar9;
  }
  iVar1 = (ctx->usr_cfg).fps.fps_out_denom;
  uVar9 = (ctx->usr_cfg).fps.fps_out_num;
  lVar6 = (long)(uVar8 * uVar11 * (long)iVar1) / (long)(int)uVar9;
  ctx->gop_total_bits = lVar6;
  uVar11 = (ulong)(iVar1 * uVar8) / (ulong)uVar9;
  ctx->bit_per_frame = (RK_U32)uVar11;
  ctx->watl_thrd = uVar8 * 3;
  iVar4 = (int)(uVar8 * 3) >> 3;
  ctx->stat_watl = iVar4;
  ctx->watl_base = iVar4;
  ctx->last_fps = (int)uVar9 / iVar1;
  if (((byte)rc_debug & 0x40) != 0) {
    _mpp_log_l(4,"rc_model_v2","gop %d total bit %lld per_frame %d statistics time %d second\n",
               "bits_model_init",(ulong)(uint)(ctx->usr_cfg).igop,lVar6,uVar11,
               (ulong)(uint)(ctx->usr_cfg).stats_time);
  }
  MVar5 = bits_model_param_init(ctx);
  MVar10 = MPP_NOK;
  if (MVar5 == MPP_OK) {
    MVar10 = MPP_OK;
    RVar7 = mpp_time();
    ctx->time_base = RVar7;
    bits_frm_init(ctx);
    if (((byte)rc_debug & 1) != 0) {
      MVar10 = MPP_OK;
      _mpp_log_l(4,"rc_model_v2","leave %p\n","bits_model_init",ctx);
    }
  }
  return MVar10;
}

Assistant:

MPP_RET bits_model_init(RcModelV2Ctx *ctx)
{
    RcCfg *usr_cfg = &ctx->usr_cfg;
    RK_S32 gop_len = ctx->usr_cfg.igop;
    RcFpsCfg *fps = &ctx->usr_cfg.fps;
    RK_S64 gop_bits = 0;
    RK_U32 target_bps = 0;

    rc_dbg_func("enter %p\n", ctx);

    usr_cfg->min_i_bit_prop = mpp_clip(usr_cfg->min_i_bit_prop, 10, 100);
    usr_cfg->max_i_bit_prop = mpp_clip(usr_cfg->max_i_bit_prop,
                                       usr_cfg->min_i_bit_prop, 100);
    usr_cfg->init_ip_ratio  = mpp_clip(usr_cfg->init_ip_ratio, 160, 640);

    rc_dbg_rc("min_i_bit_prop %d max_i_bit_prop %d, init_ip_ratio %d",
              usr_cfg->min_i_bit_prop, usr_cfg->max_i_bit_prop, usr_cfg->init_ip_ratio);

    if (!gop_len) {
        rc_dbg_rc("infinte gop, set default for rc bit calc\n");
        usr_cfg->igop = gop_len = 500;
    } else if (gop_len == 1) {
        rc_dbg_rc("all intra gop \n");
        usr_cfg->init_ip_ratio  = 16;

        /* disable debreath on all intra case */
        if (usr_cfg->debreath_cfg.enable)
            usr_cfg->debreath_cfg.enable = 0;

        usr_cfg->igop = gop_len = 500;
    } else {
        usr_cfg->igop = gop_len = mpp_clip(usr_cfg->igop, usr_cfg->igop, 500);
    }
    ctx->max_still_qp = 35;
    ctx->motion_sensitivity = 90;

    ctx->first_frm_flg = 1;
    ctx->gop_frm_cnt = 0;
    ctx->gop_qp_sum = 0;

    if (!usr_cfg->fps_chg_prop) {
        usr_cfg->fps_chg_prop = 25;
    }

    target_bps = ctx->usr_cfg.bps_max;
    ctx->re_calc_ratio = reenc_calc_vbr_ratio;
    switch (ctx->usr_cfg.mode) {
    case RC_CBR: {
        ctx->calc_ratio = calc_cbr_ratio;
        ctx->re_calc_ratio = reenc_calc_cbr_ratio;
        target_bps = ctx->usr_cfg.bps_target;
    } break;
    case RC_VBR: {
        ctx->calc_ratio = calc_vbr_ratio;
    } break;
    case RC_FIXQP: {
        return MPP_OK;
    }
    case RC_AVBR: {
        ctx->calc_ratio = calc_avbr_ratio;
        if (usr_cfg->bps_min && usr_cfg->bps_max) {
            ctx->min_still_percent = (RK_S64)usr_cfg->bps_min * 100 / usr_cfg->bps_max;
        } else {
            ctx->min_still_percent = 25;
        }
        rc_dbg_rc("min_still_percent  %d", ctx->min_still_percent);
    } break;
    default:
        mpp_log("rc mode set error");
        break;
    }

    ctx->target_bps = ctx->usr_cfg.bps_target;

    if (gop_len >= 1)
        gop_bits = (RK_S64)gop_len * target_bps * fps->fps_out_denom;
    else
        gop_bits = (RK_S64)fps->fps_out_num * target_bps * fps->fps_out_denom;

    ctx->gop_total_bits = gop_bits / fps->fps_out_num;
    ctx->bit_per_frame = target_bps * fps->fps_out_denom / fps->fps_out_num;
    ctx->watl_thrd = 3 * target_bps;
    ctx->stat_watl = ctx->watl_thrd  >> 3;
    ctx->watl_base = ctx->stat_watl;
    ctx->last_fps = fps->fps_out_num / fps->fps_out_denom;

    rc_dbg_rc("gop %d total bit %lld per_frame %d statistics time %d second\n",
              ctx->usr_cfg.igop, ctx->gop_total_bits, ctx->bit_per_frame,
              ctx->usr_cfg.stats_time);

    if (bits_model_param_init(ctx)) {
        return MPP_NOK;
    }
    ctx->time_base = mpp_time();
    bits_frm_init(ctx);
    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;
}